

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_Prepare(Ifn_Ntk_t *p,word *pTruth,int nVars)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  Ifn_Obj_t *pIVar6;
  
  iVar5 = p->nInps;
  if (iVar5 < nVars) {
    __assert_fail("nVars <= p->nInps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x76,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
  }
  p->pTruth = pTruth;
  p->nVars = nVars;
  iVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar2 = 1;
  }
  p->nWords = iVar2;
  iVar2 = p->nObjs;
  p->nPars = iVar2;
  if (iVar5 < iVar2) {
    pIVar6 = p->Nodes + iVar5;
    lVar3 = (long)iVar2 - (long)iVar5;
    do {
      uVar4 = *(uint *)pIVar6;
      if ((uVar4 & 7) == 6) {
        uVar1 = p->nPars;
        *(uint *)pIVar6 = uVar4 & 0xffff00fe | (uVar1 & 0xff) << 8;
        p->nPars = (1 << ((byte)uVar4 >> 3)) + uVar1;
      }
      pIVar6 = pIVar6 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  p->nParsVIni = p->nPars;
  if (1 < (uint)nVars) {
    uVar4 = nVars - 1;
    if (uVar4 == 0) {
      nVars = 0;
    }
    else {
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      nVars = (uVar1 ^ 0xffffffe0) + 0x21;
    }
  }
  p->nParsVNum = nVars;
  iVar5 = iVar5 * nVars + p->nPars;
  p->nPars = iVar5;
  if (iVar5 < 0x401) {
    memset(p->Values,0xff,(long)iVar5 << 2);
    return iVar5;
  }
  __assert_fail("p->nPars <= IFN_PAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x89,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
}

Assistant:

int Ifn_Prepare( Ifn_Ntk_t * p, word * pTruth, int nVars )
{
    int i, fVerbose = 0;
    assert( nVars <= p->nInps );
    p->pTruth = pTruth;
    p->nVars  = nVars;
    p->nWords = Abc_TtWordNum(nVars);
    p->nPars  = p->nObjs;
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        if ( p->Nodes[i].Type != IFN_DSD_PRIME )
            continue;
        p->Nodes[i].iFirst = p->nPars;
        p->nPars += (1 << p->Nodes[i].nFanins);
        if ( fVerbose )
            printf( "Node %d  Start %d  Vars %d\n", i, p->Nodes[i].iFirst, (1 << p->Nodes[i].nFanins) );
    }
    if ( fVerbose )
        printf( "Groups start %d\n", p->nPars );
    p->nParsVIni = p->nPars;
    p->nParsVNum = Abc_Base2Log(nVars);
    p->nPars    += p->nParsVNum * p->nInps;
    assert( p->nPars <= IFN_PAR );
    memset( p->Values, 0xFF, sizeof(int) * p->nPars );
    return p->nPars;
}